

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLoadNeededValues.hpp
# Opt level: O2

void TasGrid::loadNeededPoints<true,false>
               (function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
                *model,TasmanianSparseGrid *grid,size_t num_threads)

{
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
  fStack_38;
  
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&,_unsigned_long)>
  ::function(&fStack_38,model);
  loadNeededValues<true,false>(&fStack_38,grid,num_threads);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  return;
}

Assistant:

void loadNeededPoints(std::function<void(std::vector<double> const &x, std::vector<double> &y, size_t thread_id)> model,
                      TasmanianSparseGrid &grid, size_t num_threads){
    loadNeededValues<parallel_construction, overwrite_loaded>(model, grid, num_threads);
}